

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf.cc
# Opt level: O3

int realmain(int argc,char **argv)

{
  int iVar1;
  QPDFJob j;
  QPDFJob local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  QUtil::setLineBuf(_stdout);
  QPDFJob::QPDFJob(local_40);
  QPDFJob::initializeFromArgv((char **)local_40,(char *)argv);
  QPDFJob::run();
  iVar1 = QPDFJob::getExitCode();
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return iVar1;
}

Assistant:

int
realmain(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);
    QUtil::setLineBuf(stdout);

    QPDFJob j;
    try {
        // See "HOW TO ADD A COMMAND-LINE ARGUMENT" in README-maintainer.
        j.initializeFromArgv(argv);
        j.run();
    } catch (QPDFUsage& e) {
        usageExit(e.what());
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        return QPDFJob::EXIT_ERROR;
    }
    return j.getExitCode();
}